

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void adjust_active_best_and_worst_quality
               (AV1_COMP *cpi,int is_intrl_arf_boost,int *active_worst,int *active_best)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *in_RCX;
  int *in_RDX;
  long *in_RDI;
  int qdelta_1;
  int qdelta;
  int active_worst_quality;
  int active_best_quality;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0xc0ee);
  lVar5 = *in_RDI + 0x8b30;
  iVar1 = *in_RCX;
  iVar2 = *in_RDX;
  if (*(int *)((long)in_RDI + 0x423dc) != 3) {
    iVar1 = iVar1 - *(int *)(*in_RDI + 0x8b24) / 8;
    iVar2 = *(int *)(*in_RDI + 0x8b28) / 4 + iVar2;
  }
  iVar3 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  if ((((iVar3 == 0) || (*(int *)(lVar5 + 0x2138) == 0)) ||
      (iVar3 = iVar2, *(int *)(*in_RDI + 0x8b20) < 0x5f)) &&
     (iVar4 = frame_type_qdelta(cpi_00,(int)((ulong)lVar5 >> 0x20)),
     in_stack_ffffffffffffffb4 = iVar1, iVar3 = iVar1, iVar1 < iVar2 + iVar4)) {
    in_stack_ffffffffffffffb4 = iVar2 + iVar4;
    iVar3 = iVar2 + iVar4;
  }
  iVar2 = av1_frame_scaled((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((iVar2 != 0) &&
     (iVar2 = frame_is_kf_gf_arf((AV1_COMP *)
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
     iVar2 == 0)) {
    iVar2 = av1_compute_qdelta_by_rate
                      (cpi_00,(FRAME_TYPE)((ulong)lVar5 >> 0x38),(int)lVar5,
                       (double)CONCAT44(iVar1,iVar3));
    if (*(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xb] < iVar1 + iVar2) {
      iVar1 = iVar1 + iVar2;
    }
    else {
      iVar1 = *(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xb];
    }
  }
  iVar2 = clamp(iVar1,*(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[0xb],
                *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[10] + 6));
  iVar1 = clamp(iVar3,iVar2,*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[10] + 6));
  *in_RCX = iVar2;
  *in_RDX = iVar1;
  return;
}

Assistant:

static void adjust_active_best_and_worst_quality(const AV1_COMP *cpi,
                                                 const int is_intrl_arf_boost,
                                                 int *active_worst,
                                                 int *active_best) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int active_best_quality = *active_best;
  int active_worst_quality = *active_worst;
#if CONFIG_FPMT_TEST
#endif
  // Extension to max or min Q if undershoot or overshoot is outside
  // the permitted range.
  if (cpi->oxcf.rc_cfg.mode != AOM_Q) {
#if CONFIG_FPMT_TEST
    const int simulate_parallel_frame =
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
        cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
    const int extend_minq = simulate_parallel_frame
                                ? p_rc->temp_extend_minq
                                : cpi->ppi->twopass.extend_minq;
    const int extend_maxq = simulate_parallel_frame
                                ? p_rc->temp_extend_maxq
                                : cpi->ppi->twopass.extend_maxq;
    const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
    if (frame_is_intra_only(cm) ||
        (!rc->is_src_frame_alt_ref &&
         (refresh_frame->golden_frame || is_intrl_arf_boost ||
          refresh_frame->alt_ref_frame))) {
      active_best_quality -= extend_minq;
      active_worst_quality += (extend_maxq / 2);
    } else {
      active_best_quality -= extend_minq / 2;
      active_worst_quality += extend_maxq;
    }
#else
    (void)is_intrl_arf_boost;
    active_best_quality -= cpi->ppi->twopass.extend_minq / 8;
    active_worst_quality += cpi->ppi->twopass.extend_maxq / 4;
#endif
  }

#ifndef STRICT_RC
  // Static forced key frames Q restrictions dealt with elsewhere.
  if (!(frame_is_intra_only(cm)) || !p_rc->this_key_frame_forced ||
      (cpi->ppi->twopass.last_kfgroup_zeromotion_pct < STATIC_MOTION_THRESH)) {
    const int qdelta = frame_type_qdelta(cpi, active_worst_quality);
    active_worst_quality =
        AOMMAX(active_worst_quality + qdelta, active_best_quality);
  }
#endif

  // Modify active_best_quality for downscaled normal frames.
  if (av1_frame_scaled(cm) && !frame_is_kf_gf_arf(cpi)) {
    int qdelta = av1_compute_qdelta_by_rate(cpi, cm->current_frame.frame_type,
                                            active_best_quality, 2.0);
    active_best_quality =
        AOMMAX(active_best_quality + qdelta, rc->best_quality);
  }

  active_best_quality =
      clamp(active_best_quality, rc->best_quality, rc->worst_quality);
  active_worst_quality =
      clamp(active_worst_quality, active_best_quality, rc->worst_quality);

  *active_best = active_best_quality;
  *active_worst = active_worst_quality;
}